

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O1

ImageList * __thiscall aeron::Subscription::addImage(Subscription *this,Image *image)

{
  ImageList *pIVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  Image *this_00;
  ulong uVar5;
  ulong uVar6;
  size_t *psVar7;
  Image *pIVar8;
  __pointer_type pIVar9;
  Image *this_01;
  Image *image_00;
  long lVar10;
  size_t sVar11;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  sVar2 = pIVar1->m_length;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar2 + 1;
  uVar5 = SUB168(auVar3 * ZEXT816(0x128),0);
  uVar6 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar6 = 0xffffffffffffffff;
  }
  image_00 = pIVar1->m_images;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x128),8) == 0) {
    uVar5 = uVar6;
  }
  psVar7 = (size_t *)operator_new__(uVar5);
  pIVar8 = (Image *)(psVar7 + 1);
  sVar11 = sVar2 + 1;
  *psVar7 = sVar11;
  sVar4 = sVar2;
  this_00 = pIVar8;
  if (sVar11 != 0) {
    lVar10 = 0;
    this_01 = pIVar8;
    do {
      Image::Image(this_01);
      lVar10 = lVar10 + -0x128;
      this_01 = this_01 + 1;
    } while (sVar2 * -0x128 + -0x128 != lVar10);
  }
  for (; sVar4 != 0; sVar4 = sVar4 - 1) {
    Image::operator=(this_00,image_00);
    image_00 = image_00 + 1;
    this_00 = this_00 + 1;
  }
  Image::operator=(pIVar8 + sVar2,image);
  pIVar9 = (__pointer_type)operator_new(0x10);
  pIVar9->m_images = pIVar8;
  pIVar9->m_length = sVar11;
  (this->m_imageList)._M_b._M_p = pIVar9;
  return pIVar1;
}

Assistant:

struct ImageList *addImage(Image &image)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;
        auto newArray = new Image[length + 1];

        for (std::size_t i = 0; i < length; i++)
        {
            newArray[i] = oldArray[i];
        }

        newArray[length] = image; // copy-assign

        auto newImageList = new struct ImageList(newArray, length + 1);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);

        return oldImageList;
    }